

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMemCheckHandler::PostProcessBoundsCheckerTest
          (cmCTestMemCheckHandler *this,cmCTestTestResult *res,int test)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  char *pcVar5;
  reference pvVar6;
  ulong uVar7;
  string local_928 [32];
  undefined1 local_908 [8];
  ostringstream cmCTestLog_msg_3;
  string local_788 [32];
  undefined1 local_768 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_5e8 [8];
  string line;
  undefined1 local_5a8 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_430 [8];
  string log;
  ifstream ifs;
  undefined1 local_208 [8];
  string ofile;
  undefined1 local_1e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  int test_local;
  cmCTestTestResult *res_local;
  cmCTestMemCheckHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar4 = std::operator<<((ostream *)local_198,"PostProcessBoundsCheckerTest for : ");
  poVar4 = std::operator<<(poVar4,(string *)res);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x50d,pcVar5,
               (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
  std::__cxx11::string::~string
            ((string *)
             &files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1e0);
  TestOutputFileNames(this,test,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e0);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0);
  if (bVar2) {
    ofile.field_2._12_4_ = 1;
  }
  else {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1e0,0);
    std::__cxx11::string::string((string *)local_208,(string *)pvVar6);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream((void *)((long)&log.field_2 + 8),pcVar5,_S_in);
      bVar3 = std::ios::operator!((ios *)((long)&log.field_2 +
                                         *(long *)(log.field_2._8_8_ + -0x18) + 8));
      if ((bVar3 & 1) == 0) {
        std::__cxx11::string::operator+=
                  ((string *)&res->Output,
                   "******######*****Begin BOUNDS CHECKER XML******######******");
        std::__cxx11::string::operator+=((string *)&res->Output,"\n");
        std::__cxx11::string::string((string *)local_5e8);
        while( true ) {
          bVar2 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)(log.field_2._M_local_buf + 8),(string *)local_5e8,
                             (bool *)0x0,0xffffffffffffffff);
          if (!bVar2) break;
          std::__cxx11::string::operator+=((string *)&res->Output,(string *)local_5e8);
          std::__cxx11::string::operator+=((string *)&res->Output,"\n");
        }
        std::__cxx11::string::~string((string *)local_5e8);
        ofile.field_2._12_4_ = 0;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_430,"Cannot read memory tester output file: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
        poVar4 = std::operator<<((ostream *)local_5a8,(string *)local_430);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x51c,pcVar5,false);
        std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a8);
        ofile.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_430);
      }
      std::ifstream::~ifstream((void *)((long)&log.field_2 + 8));
      if (ofile.field_2._12_4_ == 0) {
        cmsys::SystemTools::Delay(1000);
        cmsys::SystemTools::RemoveFile(&this->BoundsCheckerDPBDFile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_768);
        poVar4 = std::operator<<((ostream *)local_768,"Remove: ");
        poVar4 = std::operator<<(poVar4,(string *)&this->BoundsCheckerDPBDFile);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x52b,pcVar5,
                     (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1))
        ;
        std::__cxx11::string::~string(local_788);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_768);
        cmsys::SystemTools::RemoveFile(&this->BoundsCheckerXMLFile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
        poVar4 = std::operator<<((ostream *)local_908,"Remove: ");
        poVar4 = std::operator<<(poVar4,(string *)&this->BoundsCheckerXMLFile);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x52f,pcVar5,
                     (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1))
        ;
        std::__cxx11::string::~string(local_928);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
        ofile.field_2._12_4_ = 0;
      }
    }
    else {
      ofile.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_208);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e0);
  return;
}

Assistant:

void cmCTestMemCheckHandler::PostProcessBoundsCheckerTest(
  cmCTestTestResult& res, int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "PostProcessBoundsCheckerTest for : " << res.Name
                                                           << std::endl,
                     this->Quiet);
  std::vector<std::string> files;
  this->TestOutputFileNames(test, files);
  if (files.empty()) {
    return;
  }
  std::string ofile = files[0];
  if (ofile.empty()) {
    return;
  }
  // put a scope around this to close ifs so the file can be removed
  {
    cmsys::ifstream ifs(ofile.c_str());
    if (!ifs) {
      std::string log = "Cannot read memory tester output file: " + ofile;
      cmCTestLog(this->CTest, ERROR_MESSAGE, log << std::endl);
      return;
    }
    res.Output += BOUNDS_CHECKER_MARKER;
    res.Output += "\n";
    std::string line;
    while (cmSystemTools::GetLineFromStream(ifs, line)) {
      res.Output += line;
      res.Output += "\n";
    }
  }
  cmSystemTools::Delay(1000);
  cmSystemTools::RemoveFile(this->BoundsCheckerDPBDFile);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Remove: " << this->BoundsCheckerDPBDFile << std::endl,
                     this->Quiet);
  cmSystemTools::RemoveFile(this->BoundsCheckerXMLFile);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Remove: " << this->BoundsCheckerXMLFile << std::endl,
                     this->Quiet);
}